

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

void QUnicodeTools::Tailored::myanmarAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t cVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar2 = 0;
  do {
    if (len <= lVar2) {
      return;
    }
    lVar4 = lVar2 + from;
    lVar6 = 0;
    do {
      lVar5 = len + from;
      if (len + from <= lVar4) goto LAB_00304f69;
      cVar1 = text[lVar4];
      uVar3 = 0x12;
      if (cVar1 != L'\x200d') {
        if (cVar1 == L'\x200c') {
          uVar3 = 9;
        }
        else if ((ushort)(cVar1 + L'\xefa0') < 0xffa0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (ulong)*(ushort *)(mymrCharClasses + (ulong)((ushort)cVar1 & 0x7f) * 4);
        }
      }
      lVar5 = lVar6 * 0x13;
      lVar6 = (long)(char)mymrStateTable[uVar3 + lVar5];
      lVar4 = lVar4 + 1;
    } while (-1 < lVar6);
    lVar5 = ~(ulong)(mymrStateTable[uVar3 + lVar5] != -1) + lVar4;
LAB_00304f69:
    attributes[lVar2 + from] = (QCharAttributes)((byte)attributes[lVar2 + from] | 9);
    lVar4 = lVar5 - from;
    if (len <= lVar5 - from) {
      lVar4 = len;
    }
    while (lVar2 = lVar2 + 1, lVar2 < lVar4) {
      attributes[lVar2 + from] = (QCharAttributes)((byte)attributes[lVar2 + from] & 0xfe);
    }
  } while( true );
}

Assistant:

static void myanmarAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    qsizetype end = from + len;
    qsizetype i = 0;
    Q_UNUSED(script);
    attributes += from;
    while (i < len) {
    bool invalid;
    qsizetype boundary = myanmar_nextSyllableBoundary(text, from+i, end, &invalid) - from;

    attributes[i].graphemeBoundary = true;
    attributes[i].lineBreak = true;

    if (boundary > len-1)
            boundary = len;
    i++;
    while (i < boundary) {
        attributes[i].graphemeBoundary = false;
        ++i;
    }
    assert(i == boundary);
    }
}